

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferMemoryAliasing.cpp
# Opt level: O3

void __thiscall
vkt::sparse::anon_unknown_0::BufferSparseMemoryAliasingCase::initPrograms
          (BufferSparseMemoryAliasingCase *this,SourceCollections *sourceCollections)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  ostringstream src;
  undefined1 auStack_218 [8];
  long *local_210;
  long local_208;
  long local_200 [2];
  string local_1f0;
  uint local_1d0;
  value_type local_1c8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  __s = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout (local_size_x = ",0x17);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", local_size_y = ",0x11);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", local_size_z = ",0x11);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"layout(set = 0, binding = 0, std430) writeonly buffer Output\n",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tuint result[];\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} sb_out;\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "\tuint index = gl_GlobalInvocationID.x + (gl_GlobalInvocationID.y + gl_GlobalInvocationID.z*gl_NumWorkGroups.y*gl_WorkGroupSize.y)*gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n"
             ,0xa9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tif ( index < ",0xe);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"u )\n",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\t\tsb_out.result[index] = index % ",0x21);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x400);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"u;\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t}\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"comp","");
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  local_1d0 = 5;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_210,local_208 + (long)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar3->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void BufferSparseMemoryAliasingCase::initPrograms (SourceCollections& sourceCollections) const
{
	// Create compute program
	const char* const versionDecl		= glu::getGLSLVersionDeclaration(m_glslVersion);
	const deUint32	  numInvocations	= m_bufferSizeInBytes / SIZE_OF_UINT_IN_SHADER;
	const tcu::UVec3  workGroupSize		= computeWorkGroupSize(numInvocations);

	std::ostringstream src;
	src << versionDecl << "\n"
		<< "layout (local_size_x = " << workGroupSize.x() << ", local_size_y = " << workGroupSize.y() << ", local_size_z = " << workGroupSize.z() << ") in;\n"
		<< "layout(set = 0, binding = 0, std430) writeonly buffer Output\n"
		<< "{\n"
		<< "	uint result[];\n"
		<< "} sb_out;\n"
		<< "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	uint index = gl_GlobalInvocationID.x + (gl_GlobalInvocationID.y + gl_GlobalInvocationID.z*gl_NumWorkGroups.y*gl_WorkGroupSize.y)*gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n"
		<< "	if ( index < " << m_bufferSizeInBytes / SIZE_OF_UINT_IN_SHADER << "u )\n"
		<< "	{\n"
		<< "		sb_out.result[index] = index % " << MODULO_DIVISOR << "u;\n"
		<< "	}\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}